

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

string * lightconf::escape_string(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  char utf8 [7];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = pcVar3[sVar4];
      if (0x21 < bVar1) {
        if (((bVar1 != 0x22) && (bVar1 != 0x2f)) && (bVar1 != 0x5c)) goto switchD_00114b2b_caseD_b;
        goto switchD_00114b2b_caseD_a;
      }
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      default:
switchD_00114b2b_caseD_b:
        if (bVar1 < 0x20 || bVar1 == 0x7f) break;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
        goto LAB_00114bb4;
      case 0xc:
        break;
      case 0xd:
      }
switchD_00114b2b_caseD_a:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00114bb4:
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape_string(const std::string& str) {
    const char *table = "0123456789abcdef";
    char utf8[7] = "\\u0000";
    std::string buf;

    for (unsigned char c : str) {
        switch (c) {
        case '\r': buf.append("\\r"); break;
        case '\n': buf.append("\\n"); break;
        case '\\': buf.append("\\\\"); break;
        case '/':  buf.append("\\/"); break;
        case '"':  buf.append("\\\""); break;
        case '\f': buf.append("\\f"); break;
        case '\b': buf.append("\\b"); break;
        case '\t': buf.append("\\t"); break;
        default:
            if (c < 0x20 || c == 0x7f) {
                utf8[4] = table[c >> 4];
                utf8[5] = table[c & 0xf];
                buf.append(utf8);
            } else {
                buf.append(1, c);
            }
        }
    }

    return buf;
}